

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ModportNamedPortSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::ModportNamedPortSyntax,slang::parsing::Token&>
          (BumpAllocator *this,Token *args)

{
  Token name;
  ModportNamedPortSyntax *this_00;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ModportNamedPortSyntax *)allocate(this,0x20,8);
  name.kind = args->kind;
  name._2_1_ = args->field_0x2;
  name.numFlags.raw = (args->numFlags).raw;
  name.rawLen = args->rawLen;
  name.info = args->info;
  slang::syntax::ModportNamedPortSyntax::ModportNamedPortSyntax(this_00,name);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }